

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O2

void __thiscall GrpParser::glyphAttrs(GrpParser *this)

{
  RefAST *this_00;
  ASTFactory *nodes;
  bool bVar1;
  int iVar2;
  uint uVar3;
  ASTArray *pAVar4;
  NoViableAltException *pNVar5;
  AST *pAVar6;
  AST *pAVar7;
  AST *pAVar8;
  int type;
  RefCount<AST> *pRVar9;
  AST *pAVar10;
  RefAST tmp100_AST;
  RefAST tmp99_AST;
  RefAST glyphAttrs_AST;
  ASTFactory local_f0;
  RefAST X3_AST;
  RefCount<AST> local_d8;
  RefCount<AST> local_d0;
  RefCount<AST> local_c8;
  undefined1 local_c0 [16];
  RefCount<Token> local_b0;
  ASTFactory local_a8;
  RefCount<Token> local_98;
  RefToken I;
  ASTPair currentAST;
  RefAST local_78;
  RefAST local_70;
  RefToken local_68;
  RefAST local_60;
  RefAST local_58;
  RefToken local_50;
  RefAST local_48;
  RefToken local_40;
  RefCount<Token> local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  glyphAttrs_AST = nullAST;
  currentAST.root.ref = (Ref *)0x0;
  currentAST.child.ref = (Ref *)0x0;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  I.ref = nullToken.ref;
  if (nullToken.ref != (Ref *)0x0) {
    (nullToken.ref)->count = (nullToken.ref)->count + 1;
  }
  if (glyphAttrs_AST.ref != (Ref *)0x0) {
    (glyphAttrs_AST.ref)->count = (glyphAttrs_AST.ref)->count + 5;
  }
  local_c8.ref = glyphAttrs_AST.ref;
  local_f0.nodeFactory = (factory_type)glyphAttrs_AST.ref;
  local_d0.ref = glyphAttrs_AST.ref;
  local_d8.ref = glyphAttrs_AST.ref;
  X3_AST = glyphAttrs_AST;
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&tmp100_AST,this,1);
  RefCount<Token>::operator=(&I,(RefCount<Token> *)&tmp100_AST);
  RefCount<Token>::~RefCount((RefCount<Token> *)&tmp100_AST);
  nodes = &(this->super_LLkParser).super_Parser.astFactory;
  if (I.ref != (Ref *)0x0) {
    (I.ref)->count = (I.ref)->count + 1;
  }
  local_38.ref = I.ref;
  ASTFactory::create((ASTFactory *)&tmp100_AST,(RefToken *)nodes);
  RefCount<AST>::operator=(&local_c8,&tmp100_AST);
  RefCount<AST>::~RefCount(&tmp100_AST);
  RefCount<Token>::~RefCount(&local_38);
  Parser::match((Parser *)this,0xd);
  iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  tmp100_AST = nullAST;
  type = (int)nodes;
  if (iVar2 == 0xb) {
    if (nullAST.ref != (Ref *)0x0) {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_98,this,1);
    ASTFactory::create((ASTFactory *)&tmp99_AST,(RefToken *)nodes);
    RefCount<AST>::operator=(&tmp100_AST,&tmp99_AST);
    RefCount<AST>::~RefCount(&tmp99_AST);
    RefCount<Token>::~RefCount(&local_98);
    Parser::match((Parser *)this,0xb);
    uVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (0x3f < uVar3) {
LAB_0017065a:
      pNVar5 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_40,this,1);
      NoViableAltException::NoViableAltException(pNVar5,&local_40);
      __cxa_throw(pNVar5,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    if ((0xe000000000822000U >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
      if ((ulong)uVar3 != 0xc) goto LAB_0017065a;
    }
    else {
      attrItemList(this);
      RefCount<AST>::operator=(&local_d0,this_00);
    }
    tmp99_AST.ref = nullAST.ref;
    if (nullAST.ref != (Ref *)0x0) {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_a8.nodeFactory,this,1);
    ASTFactory::create(&local_f0,(RefToken *)nodes);
    RefCount<AST>::operator=(&tmp99_AST,(RefCount<AST> *)&local_f0);
    RefCount<AST>::~RefCount((RefCount<AST> *)&local_f0);
    RefCount<Token>::~RefCount((RefCount<Token> *)&local_a8.nodeFactory);
    Parser::match((Parser *)this,0xc);
    pAVar4 = (ASTArray *)operator_new(0x20);
    ASTArray::ASTArray(pAVar4,2);
    ASTFactory::create(&local_a8,type);
    pAVar4 = ASTArray::add(pAVar4,(RefAST *)&local_a8);
    if (local_d0.ref != (Ref *)0x0) {
      (local_d0.ref)->count = (local_d0.ref)->count + 1;
    }
    local_48.ref = local_d0.ref;
    ASTArray::add(pAVar4,&local_48);
    ASTFactory::make(&local_f0,(ASTArray *)nodes);
    RefCount<AST>::operator=((RefCount<AST> *)&local_f0.nodeFactory,(RefCount<AST> *)&local_f0);
    RefCount<AST>::~RefCount((RefCount<AST> *)&local_f0);
    RefCount<AST>::~RefCount(&local_48);
    RefCount<AST>::~RefCount((RefCount<AST> *)&local_a8);
    pRVar9 = &tmp99_AST;
  }
  else {
    if (iVar2 != 0x12) {
      pNVar5 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_68,this,1);
      NoViableAltException::NoViableAltException(pNVar5,&local_68);
      __cxa_throw(pNVar5,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    if (nullAST.ref != (Ref *)0x0) {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_b0,this,1);
    ASTFactory::create((ASTFactory *)&tmp99_AST,(RefToken *)nodes);
    RefCount<AST>::operator=(&tmp100_AST,&tmp99_AST);
    RefCount<AST>::~RefCount(&tmp99_AST);
    RefCount<Token>::~RefCount(&local_b0);
    Parser::match((Parser *)this,0x12);
    iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    bVar1 = BitSet::member(&_tokenSet_25,iVar2);
    if (bVar1) {
      iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
      bVar1 = BitSet::member(&_tokenSet_26,iVar2);
      if (!bVar1) goto LAB_00170342;
      attrItemFlat(this);
      pRVar9 = &local_d8;
    }
    else {
LAB_00170342:
      iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      bVar1 = BitSet::member(&_tokenSet_25,iVar2);
      if (!bVar1) {
LAB_001706a9:
        pNVar5 = (NoViableAltException *)__cxa_allocate_exception(0x40);
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_50,this,1);
        NoViableAltException::NoViableAltException(pNVar5,&local_50);
        __cxa_throw(pNVar5,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      }
      iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
      if (iVar2 != 0xb) goto LAB_001706a9;
      attrItemStruct(this);
      pRVar9 = &X3_AST;
    }
    RefCount<AST>::operator=(pRVar9,this_00);
    pAVar4 = (ASTArray *)operator_new(0x20);
    ASTArray::ASTArray(pAVar4,3);
    ASTFactory::create((ASTFactory *)(local_c0 + 8),type);
    pAVar4 = ASTArray::add(pAVar4,(RefAST *)(local_c0 + 8));
    if (local_d8.ref != (Ref *)0x0) {
      (local_d8.ref)->count = (local_d8.ref)->count + 1;
    }
    local_58.ref = local_d8.ref;
    pAVar4 = ASTArray::add(pAVar4,&local_58);
    if (X3_AST.ref != (Ref *)0x0) {
      (X3_AST.ref)->count = (X3_AST.ref)->count + 1;
    }
    local_60.ref = X3_AST.ref;
    ASTArray::add(pAVar4,&local_60);
    ASTFactory::make((ASTFactory *)&tmp99_AST,(ASTArray *)nodes);
    RefCount<AST>::operator=((RefCount<AST> *)&local_f0.nodeFactory,&tmp99_AST);
    RefCount<AST>::~RefCount(&tmp99_AST);
    RefCount<AST>::~RefCount(&local_60);
    RefCount<AST>::~RefCount(&local_58);
    pRVar9 = (RefCount<AST> *)(local_c0 + 8);
  }
  RefCount<AST>::~RefCount(pRVar9);
  RefCount<AST>::~RefCount(&tmp100_AST);
  RefCount<AST>::operator=(&glyphAttrs_AST,&currentAST.root);
  pAVar4 = (ASTArray *)operator_new(0x20);
  ASTArray::ASTArray(pAVar4,3);
  ASTFactory::create((ASTFactory *)local_c0,type);
  pAVar4 = ASTArray::add(pAVar4,(RefAST *)local_c0);
  if (local_c8.ref != (Ref *)0x0) {
    (local_c8.ref)->count = (local_c8.ref)->count + 1;
  }
  local_70.ref = local_c8.ref;
  pAVar4 = ASTArray::add(pAVar4,&local_70);
  if ((Ref *)local_f0.nodeFactory != (Ref *)0x0) {
    *(uint *)((long)local_f0.nodeFactory + 8) = *(uint *)((long)local_f0.nodeFactory + 8) + 1;
  }
  local_78.ref = (Ref *)local_f0.nodeFactory;
  ASTArray::add(pAVar4,&local_78);
  ASTFactory::make((ASTFactory *)&tmp100_AST,(ASTArray *)nodes);
  RefCount<AST>::operator=(&glyphAttrs_AST,&tmp100_AST);
  RefCount<AST>::~RefCount(&tmp100_AST);
  RefCount<AST>::~RefCount(&local_78);
  RefCount<AST>::~RefCount(&local_70);
  RefCount<AST>::~RefCount((RefCount<AST> *)local_c0);
  RefCount<AST>::operator=(&currentAST.root,&glyphAttrs_AST);
  if (glyphAttrs_AST.ref == (Ref *)0x0) {
    pAVar10 = (AST *)0x0;
  }
  else {
    pAVar10 = (glyphAttrs_AST.ref)->ptr;
  }
  if (nullAST.ref == (Ref *)0x0) {
    pAVar8 = (AST *)0x0;
  }
  else {
    pAVar8 = (nullAST.ref)->ptr;
  }
  if (pAVar10 != pAVar8) {
    AST::getFirstChild((glyphAttrs_AST.ref)->ptr);
    if (tmp99_AST.ref == (Ref *)0x0) {
      pAVar6 = (AST *)0x0;
    }
    else {
      pAVar6 = (tmp99_AST.ref)->ptr;
    }
    if (nullAST.ref == (Ref *)0x0) {
      pAVar7 = (AST *)0x0;
    }
    else {
      pAVar7 = (nullAST.ref)->ptr;
    }
    if (pAVar6 != pAVar7) {
      AST::getFirstChild((glyphAttrs_AST.ref)->ptr);
      goto LAB_001705aa;
    }
  }
  if (glyphAttrs_AST.ref != (Ref *)0x0) {
    (glyphAttrs_AST.ref)->count = (glyphAttrs_AST.ref)->count + 1;
  }
  tmp100_AST = glyphAttrs_AST;
LAB_001705aa:
  RefCount<AST>::operator=(&currentAST.child,&tmp100_AST);
  RefCount<AST>::~RefCount(&tmp100_AST);
  if (pAVar10 != pAVar8) {
    RefCount<AST>::~RefCount(&tmp99_AST);
  }
  ASTPair::advanceChildToEnd(&currentAST);
  RefCount<AST>::operator=(this_00,&glyphAttrs_AST);
  RefCount<AST>::~RefCount(&X3_AST);
  RefCount<AST>::~RefCount(&local_d8);
  RefCount<AST>::~RefCount(&local_d0);
  RefCount<AST>::~RefCount((RefCount<AST> *)&local_f0.nodeFactory);
  RefCount<AST>::~RefCount(&local_c8);
  RefCount<Token>::~RefCount(&I);
  RefCount<AST>::~RefCount(&glyphAttrs_AST);
  ASTPair::~ASTPair(&currentAST);
  return;
}

Assistant:

void GrpParser::glyphAttrs() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST glyphAttrs_AST = nullAST;
	RefToken  I = nullToken;
	RefAST I_AST = nullAST;
	RefAST A_AST = nullAST;
	RefAST X1_AST = nullAST;
	RefAST X2_AST = nullAST;
	RefAST X3_AST = nullAST;
	
	try {      // for error handling
		I = LT(1);
		I_AST = astFactory.create(I);
		match(IDENT);
		{
		switch ( LA(1)) {
		case OP_LBRACE:
		{
			RefAST tmp98_AST = nullAST;
			tmp98_AST = astFactory.create(LT(1));
			match(OP_LBRACE);
			{
			switch ( LA(1)) {
			case IDENT:
			case LIT_INT:
			case LITERAL_glyph:
			case LITERAL_justify:
			case LITERAL_min:
			case LITERAL_max:
			{
				attrItemList();
				X1_AST = returnAST;
				break;
			}
			case OP_RBRACE:
			{
				break;
			}
			default:
			{
				throw NoViableAltException(LT(1));
			}
			}
			}
			RefAST tmp99_AST = nullAST;
			tmp99_AST = astFactory.create(LT(1));
			match(OP_RBRACE);
			A_AST = astFactory.make( (new ASTArray(2))->add(astFactory.create(Zattrs))->add(X1_AST));
			break;
		}
		case OP_DOT:
		{
			RefAST tmp100_AST = nullAST;
			tmp100_AST = astFactory.create(LT(1));
			match(OP_DOT);
			{
			if ((_tokenSet_25.member(LA(1))) && (_tokenSet_26.member(LA(2)))) {
				attrItemFlat();
				X2_AST = returnAST;
			}
			else if ((_tokenSet_25.member(LA(1))) && (LA(2)==OP_LBRACE)) {
				attrItemStruct();
				X3_AST = returnAST;
			}
			else {
				throw NoViableAltException(LT(1));
			}
			
			}
			A_AST = astFactory.make( (new ASTArray(3))->add(astFactory.create(Zattrs))->add(X2_AST)->add(X3_AST));
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		glyphAttrs_AST = currentAST.root;
		glyphAttrs_AST = astFactory.make( (new ASTArray(3))->add(astFactory.create(OP_PLUSEQUAL))->add(I_AST)->add(A_AST));
		currentAST.root = glyphAttrs_AST;
		currentAST.child = glyphAttrs_AST!=nullAST &&glyphAttrs_AST->getFirstChild()!=nullAST ?
			glyphAttrs_AST->getFirstChild() : glyphAttrs_AST;
		currentAST.advanceChildToEnd();
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_24);
	}
	returnAST = glyphAttrs_AST;
}